

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O3

void GEN_CS::gen_cs_example_dr<false>(cb_to_cs *c,example *ec,label *ld,label *cs_ld)

{
  cb_class *pcVar1;
  long lVar2;
  uint uVar3;
  uint32_t action;
  cb_class *cl;
  cb_class *pcVar4;
  wclass local_40;
  
  v_array<COST_SENSITIVE::wclass>::clear(&cs_ld->costs);
  v_array<COST_SENSITIVE::wclass>::clear(&(c->pred_scores).costs);
  pcVar4 = (ld->costs)._begin;
  pcVar1 = (ld->costs)._end;
  lVar2 = (long)pcVar1 - (long)pcVar4 >> 4;
  if (lVar2 == 1) {
    if ((pcVar4->cost != 3.4028235e+38) || (NAN(pcVar4->cost))) {
      if (c->num_actions == 0) {
        return;
      }
      action = 1;
      do {
        gen_cs_label<false>(c,ec,cs_ld,action);
        action = action + 1;
      } while (action <= c->num_actions);
      return;
    }
  }
  else if (lVar2 == 0) {
    if (c->num_actions == 0) {
      return;
    }
    uVar3 = 1;
    do {
      local_40.x = 3.4028235e+38;
      local_40.partial_prediction = 0.0;
      local_40.wap_value = 0.0;
      local_40.class_index = uVar3;
      v_array<COST_SENSITIVE::wclass>::push_back(&cs_ld->costs,&local_40);
      uVar3 = uVar3 + 1;
    } while (uVar3 <= c->num_actions);
    return;
  }
  for (; pcVar4 != pcVar1; pcVar4 = pcVar4 + 1) {
    gen_cs_label<false>(c,ec,cs_ld,pcVar4->action);
  }
  return;
}

Assistant:

void gen_cs_example_dr(cb_to_cs& c, example& ec, CB::label& ld, COST_SENSITIVE::label& cs_ld)
{  // this implements the doubly robust method
  cs_ld.costs.clear();
  c.pred_scores.costs.clear();
  if (ld.costs.size() == 0)  // a test example
    for (uint32_t i = 1; i <= c.num_actions; i++)
    {  // Explicit declaration for a weak compiler.
      COST_SENSITIVE::wclass temp = {FLT_MAX, i, 0., 0.};
      cs_ld.costs.push_back(temp);
    }
  else if (ld.costs.size() == 0 || (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX))
    // this is a typical example where we can perform all actions
    // in this case generate cost-sensitive example with all actions
    for (uint32_t i = 1; i <= c.num_actions; i++) gen_cs_label<is_learn>(c, ec, cs_ld, i);
  else  // this is an example where we can only perform a subset of the actions
    // in this case generate cost-sensitive example with only allowed actions
    for (auto& cl : ld.costs) gen_cs_label<is_learn>(c, ec, cs_ld, cl.action);
}